

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O1

void __thiscall binpac::FlowBuffer::MarkOrCopy(FlowBuffer *this)

{
  LineBreakStyle LVar1;
  int iVar2;
  const_byteptr puVar3;
  const_byteptr puVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  const_byteptr puVar8;
  int len;
  anon_enum_32 aVar9;
  
  if (this->message_complete_ == false) {
    if (this->mode_ == FRAME_MODE) {
      if (((this->mode_ == FRAME_MODE) && (this->state_ == CR_OR_LF_1)) &&
         (puVar3 = this->orig_data_begin_, puVar3 < this->orig_data_end_)) {
        if (*puVar3 == '\n') {
          this->orig_data_begin_ = puVar3 + 1;
        }
        this->state_ = FRAME_0;
      }
      iVar6 = this->buffer_n_;
      if (iVar6 == 0) {
        if (((long)this->frame_length_ < 0) ||
           ((long)this->orig_data_end_ - (long)this->orig_data_begin_ < (long)this->frame_length_))
        {
          if (this->chunked_ == false) {
            AppendToBuffer(this,this->orig_data_begin_,
                           *(int *)&this->orig_data_end_ - (int)this->orig_data_begin_);
          }
          this->message_complete_ = false;
        }
        else {
          this->message_complete_ = true;
        }
        return;
      }
      len = *(int *)&this->orig_data_end_ - (int)this->orig_data_begin_;
      this->message_complete_ = false;
      iVar2 = this->frame_length_;
      if ((-1 < iVar2) && (iVar2 <= iVar6 + len)) {
        len = iVar2 - iVar6;
        this->message_complete_ = true;
      }
      AppendToBuffer(this,this->orig_data_begin_,len);
      return;
    }
    if (this->mode_ == CR_OR_LF_1) {
      LVar1 = this->linebreak_style_;
      if (LVar1 == LINE_BREAKER) {
        puVar3 = this->orig_data_begin_;
        if ((puVar3 != (const_byteptr)0x0) &&
           (puVar4 = this->orig_data_end_, puVar4 != (const_byteptr)0x0)) {
          if (puVar3 < puVar4) {
            lVar7 = 0;
            do {
              if (puVar3[lVar7] == this->linebreaker_) {
                if (this->buffer_n_ == 0) {
                  this->frame_length_ = (int)lVar7;
                }
                else {
                  AppendToBuffer(this,puVar3,(int)lVar7 + 1);
                  this->buffer_n_ = this->buffer_n_ + -1;
                }
                this->message_complete_ = true;
                return;
              }
              lVar5 = lVar7 + 1;
              lVar7 = lVar7 + 1;
            } while (puVar3 + lVar5 != puVar4);
          }
          AppendToBuffer(this,puVar3,(int)puVar4 - (int)puVar3);
          return;
        }
        return;
      }
      if (LVar1 == STRICT_CRLF) {
        puVar3 = this->orig_data_begin_;
        puVar4 = this->orig_data_end_;
        if (puVar3 < puVar4) {
          aVar9 = this->state_;
          iVar6 = -1;
          puVar8 = puVar3;
          do {
            if (*puVar8 == '\n') {
              if (aVar9 == STRICT_CRLF_1) {
                this->state_ = FRAME_MODE;
                if (this->buffer_n_ == 0) {
                  this->frame_length_ = iVar6;
                }
                else {
                  AppendToBuffer(this,puVar3,iVar6 + 2);
                  this->buffer_n_ = this->buffer_n_ + -2;
                }
                this->message_complete_ = true;
                return;
              }
            }
            else if (*puVar8 == '\r') {
              this->state_ = STRICT_CRLF_1;
              aVar9 = STRICT_CRLF_1;
            }
            else {
              this->state_ = FRAME_MODE;
              aVar9 = FRAME_MODE;
            }
            puVar8 = puVar8 + 1;
            iVar6 = iVar6 + 1;
          } while (puVar8 != puVar4);
        }
        AppendToBuffer(this,puVar3,(int)puVar4 - (int)puVar3);
        return;
      }
      if (LVar1 != CR_OR_LF) {
        return;
      }
      puVar3 = this->orig_data_begin_;
      if ((puVar3 == (const_byteptr)0x0) ||
         (puVar4 = this->orig_data_end_, puVar4 == (const_byteptr)0x0)) {
        return;
      }
      if ((puVar3 < puVar4) && ((this->state_ == CR_OR_LF_1 && (*puVar3 == '\n')))) {
        this->state_ = CR_OR_LF_0;
        this->orig_data_begin_ = puVar3 + 1;
      }
      puVar3 = this->orig_data_begin_;
      if (puVar3 < puVar4) {
        lVar7 = 0;
        do {
          if (puVar3[lVar7] == '\n') {
LAB_00102920:
            if (this->buffer_n_ == 0) {
              this->frame_length_ = (int)lVar7;
            }
            else {
              AppendToBuffer(this,puVar3,(int)lVar7 + 1);
              this->buffer_n_ = this->buffer_n_ + -1;
            }
            this->message_complete_ = true;
            return;
          }
          if (puVar3[lVar7] == '\r') {
            this->state_ = CR_OR_LF_1;
            goto LAB_00102920;
          }
          lVar5 = lVar7 + 1;
          lVar7 = lVar7 + 1;
        } while (puVar3 + lVar5 != puVar4);
      }
      AppendToBuffer(this,puVar3,(int)puVar4 - (int)puVar3);
      return;
    }
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopy()
	{
	if ( ! message_complete_ )
		{
		switch ( mode_ )
			{
			case LINE_MODE:
				MarkOrCopyLine();
				break;

			case FRAME_MODE:
				MarkOrCopyFrame();
				break;

			default:
				break;
			}
		}
	}